

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_layout_row(nk_context *ctx,nk_layout_format fmt,float height,int cols,float *ratio)

{
  nk_window *win;
  nk_panel *pnVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  float fVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x44fb,
                  "void nk_layout_row(struct nk_context *, enum nk_layout_format, float, int, const float *)"
                 );
  }
  win = ctx->current;
  if (win == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x44fc,
                  "void nk_layout_row(struct nk_context *, enum nk_layout_format, float, int, const float *)"
                 );
  }
  pnVar1 = win->layout;
  if (pnVar1 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x44fd,
                  "void nk_layout_row(struct nk_context *, enum nk_layout_format, float, int, const float *)"
                 );
  }
  nk_panel_layout(ctx,win,height,cols);
  (pnVar1->row).ratio = ratio;
  if (fmt == NK_DYNAMIC) {
    fVar6 = 0.0;
    if (cols < 1) {
      iVar3 = 0;
      fVar8 = 0.0;
    }
    else {
      uVar5 = 0;
      fVar8 = 0.0;
      iVar3 = 0;
      do {
        fVar9 = ratio[uVar5];
        if (0.0 <= fVar9) {
          fVar8 = fVar8 + fVar9;
        }
        iVar3 = iVar3 + (uint)(fVar9 < 0.0);
        uVar5 = uVar5 + 1;
      } while ((uint)cols != uVar5);
    }
    fVar9 = 1.0;
    if (1.0 - fVar8 <= 1.0) {
      fVar9 = 1.0 - fVar8;
    }
    (pnVar1->row).type = NK_LAYOUT_DYNAMIC;
    bVar2 = 0.0 < fVar9;
    if (0 < iVar3) {
      if (fVar9 <= 0.0) {
        fVar9 = 0.0;
      }
      fVar6 = fVar9 / (float)iVar3;
    }
    uVar7 = -(uint)bVar2 & (uint)fVar6;
    lVar4 = 0x90;
  }
  else {
    (pnVar1->row).type = NK_LAYOUT_STATIC;
    (pnVar1->row).item_width = 0.0;
    uVar7 = 0;
    lVar4 = 0x98;
  }
  *(uint *)((long)&pnVar1->type + lVar4) = uVar7;
  (pnVar1->row).item_offset = 0.0;
  (pnVar1->row).filled = 0.0;
  return;
}

Assistant:

NK_API void
nk_layout_row(struct nk_context *ctx, enum nk_layout_format fmt,
    float height, int cols, const float *ratio)
{
    int i;
    int n_undef = 0;
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    nk_panel_layout(ctx, win, height, cols);
    if (fmt == NK_DYNAMIC) {
        /* calculate width of undefined widget ratios */
        float r = 0;
        layout->row.ratio = ratio;
        for (i = 0; i < cols; ++i) {
            if (ratio[i] < 0.0f)
                n_undef++;
            else r += ratio[i];
        }
        r = NK_SATURATE(1.0f - r);
        layout->row.type = NK_LAYOUT_DYNAMIC;
        layout->row.item_width = (r > 0 && n_undef > 0) ? (r / (float)n_undef):0;
    } else {
        layout->row.ratio = ratio;
        layout->row.type = NK_LAYOUT_STATIC;
        layout->row.item_width = 0;
        layout->row.item_offset = 0;
    }
    layout->row.item_offset = 0;
    layout->row.filled = 0;
}